

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::p_formatter<spdlog::details::scoped_padder>::format
          (p_formatter<spdlog::details::scoped_padder> *this,log_msg *param_2,tm *tm_time,
          memory_buf_t *dest)

{
  string_view_t view;
  char *pcVar1;
  scoped_padder *this_00;
  tm *in_RDX;
  scoped_padder p;
  size_t field_size;
  memory_buf_t *in_stack_ffffffffffffff78;
  memory_buf_t *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  scoped_padder *in_stack_ffffffffffffff90;
  
  scoped_padder::scoped_padder
            (in_stack_ffffffffffffff90,(size_t)in_stack_ffffffffffffff88,
             (padding_info *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  pcVar1 = ampm(in_RDX);
  this_00 = (scoped_padder *)std::char_traits<char>::length((char_type *)0x1f682a);
  view.size_ = (size_t)pcVar1;
  view.data_ = in_stack_ffffffffffffff88;
  fmt_helper::append_string_view(view,in_stack_ffffffffffffff80);
  scoped_padder::~scoped_padder(this_00);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override {
        const size_t field_size = 2;
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::append_string_view(ampm(tm_time), dest);
    }